

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

bool i4_is_triangular(int i)

{
  int local_18;
  int local_14;
  int k;
  int j;
  int i_local;
  
  if (i < 0) {
    j._3_1_ = false;
  }
  else if (i == 0) {
    j._3_1_ = true;
  }
  else {
    k = i;
    i4_to_triangle(i,&local_14,&local_18);
    if (local_14 == local_18) {
      j._3_1_ = true;
    }
    else {
      j._3_1_ = false;
    }
  }
  return j._3_1_;
}

Assistant:

bool i4_is_triangular ( int i )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_TRIANGULAR determines whether an I4 is triangular.
//
//  Discussion:
//
//    The N-th triangular number is equal to the sum of the first
//    N integers.
//
//  First Values:
//
//    Index  Value
//     0      0
//     1      1
//     2      3
//     3      6
//     4     10
//     5     15
//     6     21
//     7     28
//     8     36
//     9     45
//    10     55
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, the integer to be checked.
//
//    Output, bool I4_IS_TRIANGULAR, is TRUE if I is triangular.
//
{
  int j;
  int k;

  if ( i < 0 )
  {
    return false;
  }
  else if ( i == 0 )
  {
    return true;
  }
  else
  {
    i4_to_triangle ( i, &j, &k );

    if ( j == k )
    {
      return true;
    }
    else
    {
      return false;
    }
  }

}